

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O2

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
DoMarkArgsAsVars<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::NotId>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::NotId>
                 *con,int param_2)

{
  function<void_(int)> local_30;
  
  std::function<void_(int)>::function(&local_30,(function<void_(int)> *)this);
  VisitArguments<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::NotId>>
            (con,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return;
}

Assistant:

void DoMarkArgsAsVars(const Con& con, int ) {
    VisitArguments(con, MarkVar_);
  }